

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.cc
# Opt level: O1

void __thiscall
absl::BadStatusOrAccess::BadStatusOrAccess(BadStatusOrAccess *this,BadStatusOrAccess *other)

{
  int *piVar1;
  
  *(undefined ***)this = &PTR__BadStatusOrAccess_00208e48;
  piVar1 = (int *)(other->status_).rep_;
  (this->status_).rep_ = (uintptr_t)piVar1;
  if (((ulong)piVar1 & 1) == 0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  (this->init_what_).control_.super___atomic_base<unsigned_int>._M_i = 0;
  (this->what_)._M_dataplus._M_p = (pointer)&(this->what_).field_2;
  (this->what_)._M_string_length = 0;
  (this->what_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

BadStatusOrAccess::BadStatusOrAccess(const BadStatusOrAccess& other)
    : status_(other.status_) {}